

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O0

void __thiscall
cmCPackLog::Log(cmCPackLog *this,int tag,char *file,int line,char *msg,size_t length)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_60 [7];
  bool needTagString;
  string tagString;
  bool verbose;
  bool error;
  bool warning;
  bool debug;
  bool output;
  bool useFileAndLine;
  bool display;
  size_t length_local;
  char *msg_local;
  int line_local;
  char *file_local;
  int tag_local;
  cmCPackLog *this_local;
  
  tagString.field_2._M_local_buf[0xf] = '\0';
  tagString.field_2._M_local_buf[0xe] = this->Debug & 1;
  tagString.field_2._M_local_buf[0xd] = '\0';
  tagString.field_2._M_local_buf[0xc] = '\0';
  tagString.field_2._M_local_buf[0xb] = '\0';
  tagString.field_2._M_local_buf[10] = '\0';
  tagString.field_2._M_local_buf[9] = '\0';
  std::__cxx11::string::string(local_60);
  bVar1 = false;
  if ((this->LogOutput != (ostream *)0x0) && (this->LastTag != tag)) {
    bVar1 = true;
  }
  if ((tag & 1U) != 0) {
    tagString.field_2._M_local_buf[0xd] = '\x01';
    tagString.field_2._M_local_buf[0xf] = '\x01';
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60,",");
      }
      std::__cxx11::string::operator=(local_60,"VERBOSE");
    }
  }
  if ((tag & 8U) != 0) {
    tagString.field_2._M_local_buf[0xb] = '\x01';
    tagString.field_2._M_local_buf[0xf] = '\x01';
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60,",");
      }
      std::__cxx11::string::operator=(local_60,"WARNING");
    }
  }
  if ((tag & 0x10U) != 0) {
    tagString.field_2._M_local_buf[10] = '\x01';
    tagString.field_2._M_local_buf[0xf] = '\x01';
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60,",");
      }
      std::__cxx11::string::operator=(local_60,"ERROR");
    }
  }
  if (((tag & 4U) != 0) && ((this->Debug & 1U) != 0)) {
    tagString.field_2._M_local_buf[0xc] = '\x01';
    tagString.field_2._M_local_buf[0xf] = '\x01';
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60,",");
      }
      std::__cxx11::string::operator=(local_60,"DEBUG");
    }
    tagString.field_2._M_local_buf[0xe] = '\x01';
  }
  if (((tag & 2U) != 0) && ((this->Verbose & 1U) != 0)) {
    tagString.field_2._M_local_buf[9] = '\x01';
    tagString.field_2._M_local_buf[0xf] = '\x01';
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60,",");
      }
      std::__cxx11::string::operator=(local_60,"VERBOSE");
    }
  }
  if ((this->Quiet & 1U) != 0) {
    tagString.field_2._M_local_buf[0xf] = '\0';
  }
  if (this->LogOutput != (ostream *)0x0) {
    if (bVar1) {
      poVar3 = std::operator<<(this->LogOutput,"[");
      poVar3 = std::operator<<(poVar3,file);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,local_60);
      std::operator<<(poVar3,"] ");
    }
    std::ostream::write((char *)this->LogOutput,(long)msg);
  }
  this->LastTag = tag;
  if ((tagString.field_2._M_local_buf[0xf] & 1U) != 0) {
    if ((this->NewLine & 1U) != 0) {
      if (((tagString.field_2._M_local_buf[10] & 1U) == 0) ||
         (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
        if (((tagString.field_2._M_local_buf[0xb] & 1U) == 0) ||
           (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
          if (((tagString.field_2._M_local_buf[0xd] & 1U) == 0) ||
             (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
            if (((tagString.field_2._M_local_buf[9] & 1U) == 0) ||
               (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
              if (((tagString.field_2._M_local_buf[0xc] & 1U) == 0) ||
                 (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
                uVar2 = std::__cxx11::string::empty();
                if ((uVar2 & 1) == 0) {
                  std::operator<<(this->DefaultOutput,(string *)&this->Prefix);
                }
              }
              else {
                std::operator<<(this->DefaultOutput,(string *)&this->DebugPrefix);
              }
            }
            else {
              std::operator<<(this->DefaultOutput,(string *)&this->VerbosePrefix);
            }
          }
          else {
            std::operator<<(this->DefaultOutput,(string *)&this->OutputPrefix);
          }
        }
        else {
          std::operator<<(this->DefaultError,(string *)&this->WarningPrefix);
        }
      }
      else {
        std::operator<<(this->DefaultError,(string *)&this->ErrorPrefix);
      }
      if ((tagString.field_2._M_local_buf[0xe] & 1U) != 0) {
        if (((tagString.field_2._M_local_buf[10] & 1U) == 0) &&
           ((tagString.field_2._M_local_buf[0xb] & 1U) == 0)) {
          poVar3 = std::operator<<(this->DefaultOutput,file);
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
          std::operator<<(poVar3," ");
        }
        else {
          poVar3 = std::operator<<(this->DefaultError,file);
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
          std::operator<<(poVar3," ");
        }
      }
    }
    if (((tagString.field_2._M_local_buf[10] & 1U) == 0) &&
       ((tagString.field_2._M_local_buf[0xb] & 1U) == 0)) {
      std::ostream::write((char *)this->DefaultOutput,(long)msg);
      std::ostream::flush();
    }
    else {
      std::ostream::write((char *)this->DefaultError,(long)msg);
      std::ostream::flush();
    }
    if ((msg[length - 1] == '\n') || (2 < length)) {
      this->NewLine = true;
    }
    if ((tagString.field_2._M_local_buf[10] & 1U) != 0) {
      cmSystemTools::SetErrorOccured();
    }
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void cmCPackLog::Log(int tag, const char* file, int line,
  const char* msg, size_t length)
{
  // By default no logging
  bool display = false;

  // Display file and line number if debug
  bool useFileAndLine = this->Debug;

  bool output  = false;
  bool debug   = false;
  bool warning = false;
  bool error   = false;
  bool verbose = false;

  // When writing in file, add list of tags whenever tag changes.
  std::string tagString;
  bool needTagString = false;
  if ( this->LogOutput && this->LastTag != tag )
    {
    needTagString = true;
    }

  if ( tag & LOG_OUTPUT )
    {
    output = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( tag & LOG_WARNING )
    {
    warning = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "WARNING";
      }
    }
  if ( tag & LOG_ERROR )
    {
    error = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "ERROR";
      }
    }
  if ( tag & LOG_DEBUG && this->Debug )
    {
    debug = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "DEBUG";
      }
    useFileAndLine = true;
    }
  if ( tag & LOG_VERBOSE && this->Verbose )
    {
    verbose = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( this->Quiet )
    {
    display = false;
    }
  if ( this->LogOutput )
    {
    if ( needTagString )
      {
      *this->LogOutput << "[" << file << ":" << line << " "
        << tagString << "] ";
      }
    this->LogOutput->write(msg, length);
    }
  this->LastTag = tag;
  if ( !display )
    {
    return;
    }
  if ( this->NewLine )
    {
    if ( error && !this->ErrorPrefix.empty() )
      {
      *this->DefaultError << this->ErrorPrefix;
      }
    else if ( warning && !this->WarningPrefix.empty() )
      {
      *this->DefaultError << this->WarningPrefix;
      }
    else if ( output && !this->OutputPrefix.empty() )
      {
      *this->DefaultOutput << this->OutputPrefix;
      }
    else if ( verbose && !this->VerbosePrefix.empty() )
      {
      *this->DefaultOutput << this->VerbosePrefix;
      }
    else if ( debug && !this->DebugPrefix.empty() )
      {
      *this->DefaultOutput << this->DebugPrefix;
      }
    else if ( !this->Prefix.empty() )
      {
      *this->DefaultOutput << this->Prefix;
      }
    if ( useFileAndLine )
      {
      if ( error || warning )
        {
        *this->DefaultError << file << ":" << line << " ";
        }
      else
        {
        *this->DefaultOutput << file << ":" << line << " ";
        }
      }
    }
  if ( error || warning )
    {
    this->DefaultError->write(msg, length);
    this->DefaultError->flush();
    }
  else
    {
    this->DefaultOutput->write(msg, length);
    this->DefaultOutput->flush();
    }
  if ( msg[length-1] == '\n' || length > 2 )
    {
    this->NewLine = true;
    }

  if ( error )
    {
    cmSystemTools::SetErrorOccured();
    }
}